

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::TextureDerivateCase::init(TextureDerivateCase *this,EVP_PKEY_CTX *ctx)

{
  Vec4 *b;
  Vec4 *a;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Precision PVar7;
  DataType dataType;
  int extraout_EAX;
  int extraout_EAX_00;
  mapped_type *pmVar8;
  ulong uVar9;
  Texture2D *this_00;
  deUint32 sizedFormat;
  int y;
  int iVar10;
  tcu *this_01;
  Precision precision;
  int x;
  int x_00;
  float fVar11;
  undefined8 uVar12;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined8 uVar19;
  undefined1 auVar20 [16];
  Vec4 dy;
  undefined1 local_100 [8];
  size_type sStack_f8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragmentParams;
  undefined4 uStack_a4;
  undefined1 local_88 [8];
  pointer local_80;
  allocator<char> local_68 [16];
  float local_58;
  IVec2 viewportSize_1;
  tcu local_40 [16];
  undefined1 auVar17 [16];
  
  PVar7 = (this->super_TriangleDerivateCase).m_surfaceType;
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header;
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  dataType = TYPE_FLOAT_VEC4;
  if (PVar7 == PRECISION_HIGHP) {
    dataType = TYPE_UINT_VEC4;
  }
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::getDataTypeName(dataType);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dy,"OUTPUT_TYPE",(allocator<char> *)local_100);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragmentParams,(key_type *)&dy);
  std::__cxx11::string::assign((char *)pmVar8);
  std::__cxx11::string::~string((string *)&dy);
  precision = PVar7;
  if (PVar7 != PRECISION_HIGHP) {
    precision = (this->super_TriangleDerivateCase).m_precision;
  }
  glu::getPrecisionName(precision);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dy,"OUTPUT_PREC",(allocator<char> *)local_100);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragmentParams,(key_type *)&dy);
  std::__cxx11::string::assign((char *)pmVar8);
  std::__cxx11::string::~string((string *)&dy);
  glu::getPrecisionName((this->super_TriangleDerivateCase).m_precision);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dy,"PRECISION",(allocator<char> *)local_100);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragmentParams,(key_type *)&dy);
  std::__cxx11::string::assign((char *)pmVar8);
  std::__cxx11::string::~string((string *)&dy);
  glu::getDataTypeName((this->super_TriangleDerivateCase).m_dataType);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dy,"DATATYPE",(allocator<char> *)local_100);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragmentParams,(key_type *)&dy);
  std::__cxx11::string::assign((char *)pmVar8);
  std::__cxx11::string::~string((string *)&dy);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dy,"FUNC",(allocator<char> *)local_100);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragmentParams,(key_type *)&dy);
  std::__cxx11::string::assign((char *)pmVar8);
  std::__cxx11::string::~string((string *)&dy);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dy,"SWIZZLE",(allocator<char> *)local_100);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragmentParams,(key_type *)&dy);
  std::__cxx11::string::assign((char *)pmVar8);
  std::__cxx11::string::~string((string *)&dy);
  if (PVar7 == PRECISION_HIGHP) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dy,"CAST_TO_OUTPUT",(allocator<char> *)local_100);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&fragmentParams,(key_type *)&dy);
    std::__cxx11::string::assign((char *)pmVar8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dy,"CAST_TO_OUTPUT",(allocator<char> *)local_100);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&fragmentParams,(key_type *)&dy);
    std::__cxx11::string::assign((char *)pmVar8);
  }
  std::__cxx11::string::~string((string *)&dy);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,
             "#version 300 es\nin highp vec2 v_coord;\nlayout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\nuniform ${PRECISION} sampler2D u_sampler;\nuniform ${PRECISION} ${DATATYPE} u_scale;\nuniform ${PRECISION} ${DATATYPE} u_bias;\nvoid main (void)\n{\n\t${PRECISION} vec4 tex = texture(u_sampler, v_coord);\n\t${PRECISION} ${DATATYPE} res = ${FUNC}(tex${SWIZZLE}) * u_scale + u_bias;\n\to_color = ${CAST_TO_OUTPUT};\n}\n"
             ,local_68);
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_100,(string *)local_88);
  tcu::StringTemplate::specialize((string *)&dy,(StringTemplate *)local_100,&fragmentParams);
  std::__cxx11::string::operator=
            ((string *)&(this->super_TriangleDerivateCase).m_fragmentSrc,(string *)&dy);
  std::__cxx11::string::~string((string *)&dy);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_100);
  std::__cxx11::string::~string((string *)local_88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&fragmentParams._M_t);
  uVar9 = (ulong)(this->super_TriangleDerivateCase).m_precision;
  if (uVar9 < 3) {
    fVar11 = *(float *)(&DAT_0186273c + uVar9 * 4);
    fVar1 = *(float *)(&DAT_01862748 + uVar9 * 4);
    fVar2 = *(float *)(&DAT_01862754 + uVar9 * 4);
    fVar3 = *(float *)(&DAT_01862760 + uVar9 * 4);
    fVar4 = *(float *)(&DAT_0186276c + uVar9 * 4);
    fVar5 = *(float *)(&DAT_01862778 + uVar9 * 4);
    fVar6 = *(float *)(&DAT_01862784 + uVar9 * 4);
    (this->m_texValueMin).m_data[0] = *(float *)(&DAT_01862730 + uVar9 * 4);
    (this->m_texValueMin).m_data[1] = fVar11;
    (this->m_texValueMin).m_data[2] = fVar1;
    (this->m_texValueMin).m_data[3] = fVar2;
    (this->m_texValueMax).m_data[0] = fVar3;
    (this->m_texValueMax).m_data[1] = fVar4;
    (this->m_texValueMax).m_data[2] = fVar5;
    (this->m_texValueMax).m_data[3] = fVar6;
  }
  TriangleDerivateCase::getViewportSize((TriangleDerivateCase *)&fragmentParams);
  this_00 = (Texture2D *)operator_new(0x70);
  sizedFormat = 0x881a;
  if ((this->super_TriangleDerivateCase).m_precision == PRECISION_HIGHP) {
    sizedFormat = 0x8814;
  }
  glu::Texture2D::Texture2D
            (this_00,((this->super_TriangleDerivateCase).super_TestCase.m_context)->m_renderCtx,
             sizedFormat,fragmentParams._M_t._M_impl._0_4_,fragmentParams._M_t._M_impl._4_4_);
  this->m_texture = this_00;
  tcu::Texture2D::allocLevel(&this_00->m_refTexture,0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&fragmentParams,0.0);
  *(ulong *)(this->super_TriangleDerivateCase).m_coordMin.m_data =
       CONCAT44(fragmentParams._M_t._M_impl._4_4_,fragmentParams._M_t._M_impl._0_4_);
  *(ulong *)((this->super_TriangleDerivateCase).m_coordMin.m_data + 2) =
       CONCAT44(fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&fragmentParams,1.0);
  *(ulong *)(this->super_TriangleDerivateCase).m_coordMax.m_data =
       CONCAT44(fragmentParams._M_t._M_impl._4_4_,fragmentParams._M_t._M_impl._0_4_);
  *(ulong *)((this->super_TriangleDerivateCase).m_coordMax.m_data + 2) =
       CONCAT44(fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&fragmentParams,
             &((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess);
  b = &this->m_texValueMin;
  a = &this->m_texValueMax;
  auVar13 = extraout_XMM0;
  for (iVar10 = 0; iVar10 < (int)fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
      iVar10 = iVar10 + 1) {
    auVar14._4_12_ = auVar13._4_12_;
    auVar14._0_4_ = (float)iVar10 + 0.5;
    auVar18 = auVar14;
    for (x_00 = 0; x_00 < (int)fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
        x_00 = x_00 + 1) {
      auVar15._4_12_ = auVar18._4_12_;
      auVar15._0_4_ = (float)x_00 + 0.5;
      uStack_a4 = auVar13._4_4_;
      auVar16._12_4_ = auVar18._12_4_;
      auVar16._0_8_ = auVar15._0_8_;
      auVar16._8_4_ = auVar18._4_4_;
      auVar18._8_8_ = auVar16._8_8_;
      auVar18._4_4_ = auVar14._0_4_;
      auVar18._0_4_ = auVar15._0_4_;
      auVar17._0_12_ = auVar18._0_12_;
      auVar17._12_4_ = uStack_a4;
      auVar20._0_4_ =
           (float)(int)fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      auVar20._4_4_ = (float)(int)fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
      auVar20._8_8_ = 0;
      auVar18 = divps(auVar17,auVar20);
      dy.m_data._0_8_ = auVar18._0_8_;
      dy.m_data[2] = (auVar18._4_4_ + auVar18._0_4_) * 0.5;
      dy.m_data[3] = 1.0 - dy.m_data[2];
      tcu::operator-((tcu *)local_68,a,b);
      tcu::operator*((tcu *)local_88,(Vector<float,_4> *)local_68,&dy);
      tcu::operator+((tcu *)local_100,b,(Vector<float,_4> *)local_88);
      tcu::PixelBufferAccess::setPixel
                ((PixelBufferAccess *)&fragmentParams,(Vec4 *)local_100,x_00,iVar10,0);
      auVar18 = extraout_XMM0_00;
    }
    auVar13 = auVar18;
  }
  (*this->m_texture->_vptr_Texture2D[2])();
  if ((this->super_TriangleDerivateCase).m_surfaceType == SURFACETYPE_FLOAT_FBO) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&fragmentParams,1.0);
    *(ulong *)(this->super_TriangleDerivateCase).m_derivScale.m_data =
         CONCAT44(fragmentParams._M_t._M_impl._4_4_,fragmentParams._M_t._M_impl._0_4_);
    *(ulong *)((this->super_TriangleDerivateCase).m_derivScale.m_data + 2) =
         CONCAT44(fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&fragmentParams,0.0);
    uVar12 = CONCAT44(fragmentParams._M_t._M_impl._4_4_,fragmentParams._M_t._M_impl._0_4_);
    uVar19 = CONCAT44(fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                      fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
    iVar10 = extraout_EAX;
    goto LAB_010f14e9;
  }
  TriangleDerivateCase::getViewportSize((TriangleDerivateCase *)&viewportSize_1);
  local_58 = (float)viewportSize_1.m_data[0];
  fVar11 = (float)viewportSize_1.m_data[1];
  tcu::operator-((tcu *)&dy,a,b);
  local_100._0_4_ = local_58;
  local_100._4_4_ = local_58;
  sStack_f8 = CONCAT44(local_58 * -0.5,local_58 * 0.5);
  tcu::operator/((tcu *)&fragmentParams,(Vector<float,_4> *)&dy,(Vector<float,_4> *)local_100);
  tcu::operator-((tcu *)local_100,a,b);
  local_80 = (pointer)CONCAT44(fVar11 * -0.5,fVar11 * 0.5);
  local_88._0_4_ = fVar11;
  local_88._4_4_ = fVar11;
  tcu::operator/((tcu *)&dy,(Vector<float,_4> *)local_100,(Vector<float,_4> *)local_88);
  iVar10 = *(int *)&(this->super_TriangleDerivateCase).field_0xf4;
  if (iVar10 == 2) {
    tcu::abs<float,4>((tcu *)local_68,(Vector<float,_4> *)&fragmentParams);
    tcu::abs<float,4>(local_40,&dy);
    this_01 = (tcu *)local_88;
    tcu::operator+(this_01,(Vector<float,_4> *)local_68,(Vector<float,_4> *)local_40);
LAB_010f14d5:
    tcu::operator/((tcu *)local_100,0.5,(Vector<float,_4> *)this_01);
    *(ulong *)(this->super_TriangleDerivateCase).m_derivScale.m_data =
         CONCAT44(local_100._4_4_,local_100._0_4_);
    *(size_type *)((this->super_TriangleDerivateCase).m_derivScale.m_data + 2) = sStack_f8;
    iVar10 = extraout_EAX_00;
  }
  else {
    if (iVar10 == 1) {
      this_01 = (tcu *)&dy;
      goto LAB_010f14d5;
    }
    if (iVar10 == 0) {
      this_01 = (tcu *)&fragmentParams;
      goto LAB_010f14d5;
    }
  }
  uVar12 = 0;
  uVar19 = 0;
LAB_010f14e9:
  *(undefined8 *)(this->super_TriangleDerivateCase).m_derivBias.m_data = uVar12;
  *(undefined8 *)((this->super_TriangleDerivateCase).m_derivBias.m_data + 2) = uVar19;
  return iVar10;
}

Assistant:

void TextureDerivateCase::init (void)
{
	// Generate shader
	{
		const char* fragmentTmpl =
			"#version 300 es\n"
			"in highp vec2 v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} sampler2D u_sampler;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} vec4 tex = texture(u_sampler, v_coord);\n"
			"	${PRECISION} ${DATATYPE} res = ${FUNC}(tex${SWIZZLE}) * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n";

		const bool			packToInt		= m_surfaceType == SURFACETYPE_FLOAT_FBO;
		map<string, string> fragmentParams;

		fragmentParams["OUTPUT_TYPE"]		= glu::getDataTypeName(packToInt ? glu::TYPE_UINT_VEC4 : glu::TYPE_FLOAT_VEC4);
		fragmentParams["OUTPUT_PREC"]		= glu::getPrecisionName(packToInt ? glu::PRECISION_HIGHP : m_precision);
		fragmentParams["PRECISION"]			= glu::getPrecisionName(m_precision);
		fragmentParams["DATATYPE"]			= glu::getDataTypeName(m_dataType);
		fragmentParams["FUNC"]				= getDerivateFuncName(m_func);
		fragmentParams["SWIZZLE"]			= m_dataType == glu::TYPE_FLOAT_VEC4 ? "" :
											  m_dataType == glu::TYPE_FLOAT_VEC3 ? ".xyz" :
											  m_dataType == glu::TYPE_FLOAT_VEC2 ? ".xy" :
											  /* TYPE_FLOAT */					   ".x";

		if (packToInt)
		{
			fragmentParams["CAST_TO_OUTPUT"]	= m_dataType == glu::TYPE_FLOAT_VEC4 ? "floatBitsToUint(res)" :
												  m_dataType == glu::TYPE_FLOAT_VEC3 ? "floatBitsToUint(vec4(res, 1.0))" :
												  m_dataType == glu::TYPE_FLOAT_VEC2 ? "floatBitsToUint(vec4(res, 0.0, 1.0))" :
												  /* TYPE_FLOAT */					   "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
		}
		else
		{
			fragmentParams["CAST_TO_OUTPUT"]	= m_dataType == glu::TYPE_FLOAT_VEC4 ? "res" :
												  m_dataType == glu::TYPE_FLOAT_VEC3 ? "vec4(res, 1.0)" :
												  m_dataType == glu::TYPE_FLOAT_VEC2 ? "vec4(res, 0.0, 1.0)" :
												  /* TYPE_FLOAT */					   "vec4(res, 0.0, 0.0, 1.0)";
		}

		m_fragmentSrc = tcu::StringTemplate(fragmentTmpl).specialize(fragmentParams);
	}

	// Texture size matches viewport and nearest sampling is used. Thus texture sampling
	// is equal to just interpolating the texture value range.

	// Determine value range for texture.

	switch (m_precision)
	{
		case glu::PRECISION_HIGHP:
			m_texValueMin = tcu::Vec4(-97.f, 0.2f, 71.f, 74.f);
			m_texValueMax = tcu::Vec4(-13.2f, -77.f, 44.f, 76.f);
			break;

		case glu::PRECISION_MEDIUMP:
			m_texValueMin = tcu::Vec4(-37.0f, 47.f, -7.f, 0.0f);
			m_texValueMax = tcu::Vec4(-1.0f, 12.f, 7.f, 19.f);
			break;

		case glu::PRECISION_LOWP:
			m_texValueMin = tcu::Vec4(0.0f, -1.0f, 0.0f, 1.0f);
			m_texValueMax = tcu::Vec4(1.0f, 1.0f, -1.0f, -1.0f);
			break;

		default:
			DE_ASSERT(false);
	}

	// Lowp and mediump cases use RGBA16F format, while highp uses RGBA32F.
	{
		const tcu::IVec2 viewportSize = getViewportSize();
		DE_ASSERT(!m_texture);
		m_texture = new glu::Texture2D(m_context.getRenderContext(), m_precision == glu::PRECISION_HIGHP ? GL_RGBA32F : GL_RGBA16F, viewportSize.x(), viewportSize.y());
		m_texture->getRefTexture().allocLevel(0);
	}

	// Texture coordinates
	m_coordMin = tcu::Vec4(0.0f);
	m_coordMax = tcu::Vec4(1.0f);

	// Fill with gradients.
	{
		const tcu::PixelBufferAccess level0 = m_texture->getRefTexture().getLevel(0);
		for (int y = 0; y < level0.getHeight(); y++)
		{
			for (int x = 0; x < level0.getWidth(); x++)
			{
				const float		xf		= (float(x)+0.5f) / float(level0.getWidth());
				const float		yf		= (float(y)+0.5f) / float(level0.getHeight());
				const tcu::Vec4	s		= tcu::Vec4(xf, yf, (xf+yf)/2.0f, 1.0f - (xf+yf)/2.0f);

				level0.setPixel(m_texValueMin + (m_texValueMax - m_texValueMin)*s, x, y);
			}
		}
	}

	m_texture->upload();

	if (m_surfaceType == SURFACETYPE_FLOAT_FBO)
	{
		// No scale or bias used for accuracy.
		m_derivScale	= tcu::Vec4(1.0f);
		m_derivBias		= tcu::Vec4(0.0f);
	}
	else
	{
		// Compute scale - bias that normalizes to 0..1 range.
		const tcu::IVec2	viewportSize	= getViewportSize();
		const float			w				= float(viewportSize.x());
		const float			h				= float(viewportSize.y());
		const tcu::Vec4		dx				= (m_texValueMax - m_texValueMin) / tcu::Vec4(w, w, w*0.5f, -w*0.5f);
		const tcu::Vec4		dy				= (m_texValueMax - m_texValueMin) / tcu::Vec4(h, h, h*0.5f, -h*0.5f);

		switch (m_func)
		{
			case DERIVATE_DFDX:
				m_derivScale = 0.5f / dx;
				break;

			case DERIVATE_DFDY:
				m_derivScale = 0.5f / dy;
				break;

			case DERIVATE_FWIDTH:
				m_derivScale = 0.5f / (tcu::abs(dx) + tcu::abs(dy));
				break;

			default:
				DE_ASSERT(false);
		}

		m_derivBias = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
	}
}